

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSet
          (ExtensionSet *this,CodedInputStream *input,Message *containing_type,
          UnknownFieldSet *unknown_fields)

{
  DescriptorPool *extension_finder;
  DescriptorPool *this_00;
  DescriptorPool *pool;
  Descriptor *factory;
  CodedInputStream *in_RSI;
  MessageSetFieldSkipper *in_RDI;
  DescriptorPoolExtensionFinder finder_1;
  GeneratedExtensionFinder finder;
  MessageSetFieldSkipper skipper;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  GeneratedExtensionFinder *in_stack_ffffffffffffff50;
  CodedInputStream *in_stack_ffffffffffffff80;
  ExtensionSet *in_stack_ffffffffffffff88;
  undefined1 local_1;
  
  MessageSetFieldSkipper::MessageSetFieldSkipper
            ((MessageSetFieldSkipper *)in_stack_ffffffffffffff50,
             (UnknownFieldSet *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  extension_finder = io::CodedInputStream::GetExtensionPool(in_RSI);
  if (extension_finder == (DescriptorPool *)0x0) {
    GeneratedExtensionFinder::GeneratedExtensionFinder
              (in_stack_ffffffffffffff50,
               (MessageLite *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    local_1 = ParseMessageSet(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (ExtensionFinder *)extension_finder,in_RDI);
    GeneratedExtensionFinder::~GeneratedExtensionFinder((GeneratedExtensionFinder *)0x545f74);
  }
  else {
    this_00 = io::CodedInputStream::GetExtensionPool(in_RSI);
    pool = (DescriptorPool *)io::CodedInputStream::GetExtensionFactory(in_RSI);
    factory = Message::GetDescriptor((Message *)in_stack_ffffffffffffff50);
    DescriptorPoolExtensionFinder::DescriptorPoolExtensionFinder
              ((DescriptorPoolExtensionFinder *)this_00,pool,(MessageFactory *)factory,
               (Descriptor *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    local_1 = ParseMessageSet(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (ExtensionFinder *)extension_finder,in_RDI);
    DescriptorPoolExtensionFinder::~DescriptorPoolExtensionFinder
              ((DescriptorPoolExtensionFinder *)0x546044);
  }
  MessageSetFieldSkipper::~MessageSetFieldSkipper((MessageSetFieldSkipper *)0x54606d);
  return local_1;
}

Assistant:

bool ExtensionSet::ParseMessageSet(io::CodedInputStream* input,
                                   const Message* containing_type,
                                   UnknownFieldSet* unknown_fields) {
  MessageSetFieldSkipper skipper(unknown_fields);
  if (input->GetExtensionPool() == NULL) {
    GeneratedExtensionFinder finder(containing_type);
    return ParseMessageSet(input, &finder, &skipper);
  } else {
    DescriptorPoolExtensionFinder finder(input->GetExtensionPool(),
                                         input->GetExtensionFactory(),
                                         containing_type->GetDescriptor());
    return ParseMessageSet(input, &finder, &skipper);
  }
}